

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.cpp
# Opt level: O3

void compute_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  
  uVar3 = iimage->width;
  lVar7 = (long)(int)uVar3;
  lVar18 = (long)iimage->data_width;
  uVar4 = iimage->height;
  pfVar12 = iimage->data;
  uVar1 = lVar7 - 2;
  uVar17 = (ulong)uVar3;
  if (lVar7 < 3) {
    fVar20 = 0.0;
    fVar19 = 0.0;
    uVar6 = 0;
  }
  else {
    fVar19 = 0.0;
    fVar20 = 0.0;
    uVar6 = 0;
    do {
      fVar5 = fVar19 + gray_image[uVar6];
      pfVar12[uVar6] = fVar5;
      fVar19 = fVar5 + gray_image[uVar6 + 1];
      pfVar12[uVar6 + 1] = fVar19;
      fVar2 = gray_image[uVar17 + uVar6];
      pfVar12[lVar18 + uVar6] = fVar5 + fVar20 + fVar2;
      fVar20 = fVar20 + fVar2 + gray_image[uVar17 + uVar6 + 1];
      pfVar12[lVar18 + uVar6 + 1] = fVar20 + pfVar12[uVar6 + 1];
      uVar6 = uVar6 + 2;
    } while (uVar6 < (uVar1 & 0xffffffff));
  }
  if ((int)uVar6 < (int)uVar3) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      fVar19 = fVar19 + gray_image[uVar6];
      pfVar12[uVar6] = fVar19;
      fVar20 = fVar20 + gray_image[lVar7 + uVar6];
      pfVar12[lVar18 + uVar6] = fVar19 + fVar20;
      uVar6 = uVar6 + 1;
    } while (uVar17 != uVar6);
  }
  uVar6 = 2;
  if (4 < (int)uVar4) {
    local_70 = pfVar12 + lVar18;
    pfVar9 = pfVar12 + lVar18 * 3 + 1;
    local_78 = pfVar12 + lVar18 * 3;
    local_88 = pfVar12 + lVar18 * 2;
    pfVar15 = pfVar12 + lVar18 + 1;
    pfVar10 = pfVar12 + lVar18 * 2 + 1;
    uVar6 = 2;
    pfVar14 = gray_image + lVar7 * 2;
    local_80 = gray_image + lVar7 * 3;
    pfVar16 = gray_image + lVar7 * 3 + 1;
    pfVar8 = gray_image + lVar7 * 2 + 1;
    do {
      fVar20 = 0.0;
      fVar19 = 0.0;
      uVar11 = 0;
      if (2 < (int)uVar3) {
        uVar11 = 0;
        do {
          fVar2 = pfVar8[uVar11 - 1];
          fVar5 = fVar19 + fVar2 + pfVar15[uVar11 - 1];
          pfVar10[uVar11 - 1] = fVar5;
          fVar19 = fVar19 + fVar2 + pfVar8[uVar11];
          pfVar10[uVar11] = fVar19 + pfVar15[uVar11];
          fVar2 = pfVar16[uVar11 - 1];
          pfVar9[uVar11 - 1] = fVar5 + fVar20 + fVar2;
          fVar20 = fVar20 + fVar2 + pfVar16[uVar11];
          pfVar9[uVar11] = fVar20 + pfVar10[uVar11];
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)uVar1);
      }
      if ((int)uVar11 < (int)uVar3) {
        uVar11 = uVar11 & 0xffffffff;
        lVar13 = 0;
        do {
          fVar19 = fVar19 + pfVar14[uVar11 + lVar13];
          fVar2 = local_70[uVar11 + lVar13];
          local_88[uVar11 + lVar13] = fVar19 + fVar2;
          fVar20 = fVar20 + local_80[uVar11 + lVar13];
          local_78[uVar11 + lVar13] = fVar19 + fVar2 + fVar20;
          lVar13 = lVar13 + 1;
        } while (uVar17 - uVar11 != lVar13);
      }
      uVar6 = uVar6 + 2;
      local_78 = local_78 + lVar18 * 2;
      local_80 = local_80 + lVar7 * 2;
      local_88 = local_88 + lVar18 * 2;
      local_70 = local_70 + lVar18 * 2;
      pfVar9 = pfVar9 + lVar18 * 2;
      pfVar16 = pfVar16 + lVar7 * 2;
      pfVar15 = pfVar15 + lVar18 * 2;
      pfVar10 = pfVar10 + lVar18 * 2;
      pfVar8 = pfVar8 + lVar7 * 2;
      pfVar14 = pfVar14 + lVar7 * 2;
    } while (uVar6 < uVar4 - 2);
  }
  if ((int)uVar6 < (int)uVar4) {
    uVar6 = uVar6 & 0xffffffff;
    lVar7 = (long)(int)uVar3;
    lVar13 = (uVar6 - 1) * lVar18;
    pfVar15 = pfVar12 + lVar18 * uVar6 + 1;
    pfVar14 = pfVar12 + lVar18 * uVar6;
    pfVar10 = pfVar12 + lVar13 + 1;
    pfVar12 = pfVar12 + lVar13;
    pfVar16 = gray_image + lVar7 * uVar6 + 1;
    pfVar9 = gray_image + lVar7 * uVar6;
    do {
      fVar19 = 0.0;
      uVar17 = 0;
      if (2 < (int)uVar3) {
        uVar17 = 0;
        do {
          fVar20 = pfVar16[uVar17 - 1];
          pfVar15[uVar17 - 1] = fVar19 + fVar20 + pfVar10[uVar17 - 1];
          fVar19 = fVar19 + fVar20 + pfVar16[uVar17];
          pfVar15[uVar17] = fVar19 + pfVar10[uVar17];
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < (long)(int)uVar1);
      }
      if ((int)uVar17 < (int)uVar3) {
        uVar17 = uVar17 & 0xffffffff;
        do {
          fVar19 = fVar19 + pfVar9[uVar17];
          pfVar14[uVar17] = fVar19 + pfVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar3 != uVar17);
      }
      uVar6 = uVar6 + 1;
      pfVar15 = pfVar15 + lVar18;
      pfVar10 = pfVar10 + lVar18;
      pfVar16 = pfVar16 + lVar7;
      pfVar14 = pfVar14 + lVar18;
      pfVar12 = pfVar12 + lVar18;
      pfVar9 = pfVar9 + lVar7;
    } while (uVar6 != uVar4);
  }
  return;
}

Assistant:

void compute_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float sum = 0.0f;
    float sum1 = 0.0f;
    
    int data_width = iimage->data_width;
    int width = iimage->width;
    int width_limit = width - 2;
    int height_limit = iimage->height - 2;
    float *iimage_data = iimage->data;

    int i = 0;
    // first row extra, since we don't have 0 padding
    for (i = 0; i < width_limit; i += 2) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        sum += gray_image[i + 1];
        iimage_data[i + 1] = sum;

        sum1 += gray_image[width + i];
        iimage_data[data_width + i] = iimage_data[i] + sum1;
        sum1 += gray_image[width + i + 1];
        iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
    }

    // Handle last element of an image with odd width extra.
    // If previous stride = 2, then there should only be one element covered in this loop.
    // This might change if we increase the stride.
    for (; i < width; ++i) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        // printf("row 0, col %i sum: %f\n", i, sum);
        sum1 += gray_image[width + i];
        // printf("row 1, col %i sum: %f\n", i, sum1);
        iimage_data[data_width + i] = iimage_data[i] + sum1;
    }

    // Handle all elements after the first row.
    i = 2;
    for (; i < height_limit; i += 2) {
        sum = 0.0f;
        sum1 = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            sum1 += gray_image[(i + 1) * width + j + 1];
            iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
        }
        // printf("j: %i\n", j);

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; j < width; ++j) {
            // printf("j: %i; sum1: %f\n", j, sum1);
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            // printf("sum1: %f\n", sum1);
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
        }
    }

    // Handle last element of an image with odd height extra.
    // If previous stride = 2, then there should only be one row covered in this loop.
    // This might change if we increase the stride.
    for (; i < iimage->height ; ++i) {
        sum = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            // printf("j: %i; sum1: %f\n", j, sum);

            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
        }
        // printf("j: %i\n", j);

        for (; j < width; ++j) {
            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
        }
    }
}